

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O2

bool deqp::gles3::Functional::anon_unknown_0::compareSingleColor
               (TestLog *log,Surface *surface,RGBA expectedColor,RGBA threshold)

{
  ostringstream *poVar1;
  RGBA a;
  bool bVar2;
  void *__buf;
  int iVar3;
  int iVar4;
  int iVar5;
  allocator<char> local_202;
  allocator<char> local_201;
  TestLog *local_200;
  RGBA local_1f8;
  RGBA local_1f4;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_200 = log;
  local_1f8.m_value = expectedColor.m_value;
  local_1f4.m_value = threshold.m_value;
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Expecting ");
  tcu::operator<<((ostream *)poVar1,local_1f8);
  std::operator<<((ostream *)poVar1," with threshold ");
  tcu::operator<<((ostream *)poVar1,local_1f4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar4 = 0;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  iVar3 = 0;
  do {
    if (surface->m_height <= iVar3) {
      if (iVar4 < 1) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_200;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Image comparison passed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_200;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Found ");
        std::ostream::operator<<(poVar1,iVar4);
        std::operator<<((ostream *)poVar1," invalid pixels, comparison FAILED!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"ResultImage",&local_201);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"Result Image",&local_202);
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,&local_1d0,&local_1f0,surface,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1b0,(int)local_200,__buf,(size_t)surface);
        tcu::LogImage::~LogImage((LogImage *)local_1b0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      return iVar4 < 1;
    }
    for (iVar5 = 0; iVar5 < surface->m_width; iVar5 = iVar5 + 1) {
      a.m_value = *(deUint32 *)
                   ((long)(surface->m_pixels).m_ptr + (long)(surface->m_width * iVar3 + iVar5) * 4);
      bVar2 = tcu::compareThreshold(a,local_1f8,local_1f4);
      if (!bVar2) {
        if (iVar4 < 10) {
          local_1b0._0_8_ = local_200;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"ERROR: Got ");
          tcu::operator<<((ostream *)poVar1,a);
          std::operator<<((ostream *)poVar1," at (");
          std::ostream::operator<<(poVar1,iVar5);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,iVar3);
          std::operator<<((ostream *)poVar1,")!");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01104e5f:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        }
        else if (iVar4 == 10) {
          local_1b0._0_8_ = local_200;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::operator<<((ostream *)(local_1b0 + 8),"...");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_01104e5f;
        }
        iVar4 = iVar4 + 1;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static bool compareSingleColor (tcu::TestLog& log, const tcu::Surface& surface, tcu::RGBA expectedColor, tcu::RGBA threshold)
{
	const int	maxPrints			= 10;
	int			numFailedPixels		= 0;

	log << TestLog::Message << "Expecting " << expectedColor << " with threshold " << threshold << TestLog::EndMessage;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			const tcu::RGBA		resultColor		= surface.getPixel(x, y);
			const bool			isOk			= compareThreshold(resultColor, expectedColor, threshold);

			if (!isOk)
			{
				if (numFailedPixels < maxPrints)
					log << TestLog::Message << "ERROR: Got " << resultColor << " at (" << x << ", " << y << ")!" << TestLog::EndMessage;
				else if (numFailedPixels == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailedPixels += 1;
			}
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Message << "Found " << numFailedPixels << " invalid pixels, comparison FAILED!" << TestLog::EndMessage;
		log << TestLog::Image("ResultImage", "Result Image", surface);
		return false;
	}
	else
	{
		log << TestLog::Message << "Image comparison passed." << TestLog::EndMessage;
		return true;
	}
}